

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

void __thiscall File::~File(File *this)

{
  pointer ppTVar1;
  Tag *this_00;
  uint uVar2;
  ulong uVar3;
  
  this->_vptr_File = (_func_int **)&PTR_load_0010abb8;
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    ppTVar1 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= uVar3) break;
    this_00 = ppTVar1[uVar3];
    if (this_00 != (Tag *)0x0) {
      Tag::~Tag(this_00);
      operator_delete(this_00,0x60);
      (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = (Tag *)0x0;
    }
    uVar2 = uVar2 + 1;
  }
  std::_Vector_base<Tag_*,_std::allocator<Tag_*>_>::~_Vector_base
            (&(this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>);
  return;
}

Assistant:

File::~File()
{
	for ( unsigned int i = 0; i < _tags.size();i++ )
	{
		if ( _tags[i] != NULL )
		{
			delete _tags[i];
			_tags[i] = NULL;
		}
	}
}